

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  uint_least8_t *puVar1;
  basic_format_specs<char> *pbVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  byte bVar6;
  char *begin_00;
  char *local_38;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_30;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  pcVar5 = parse_align<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                     (begin,end,handler);
  if (pcVar5 == end) {
    return pcVar5;
  }
  cVar3 = *pcVar5;
  if (cVar3 == ' ') {
    bVar6 = 1;
LAB_001101f5:
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::check_sign(handler);
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | bVar6;
    pcVar5 = pcVar5 + 1;
  }
  else {
    if (cVar3 == '+') {
      bVar6 = 3;
      goto LAB_001101f5;
    }
    if (cVar3 == '-') {
      bVar6 = 4;
      goto LAB_001101f5;
    }
  }
  if (pcVar5 == end) {
    return pcVar5;
  }
  cVar3 = *pcVar5;
  if (cVar3 == '#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_hash(handler);
    pcVar5 = pcVar5 + 1;
    if (pcVar5 == end) {
      return pcVar5;
    }
    cVar3 = *pcVar5;
  }
  if (cVar3 == '0') {
    if (8 < handler->arg_type_ - named_arg_type) {
      basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar2 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    (pbVar2->super_align_spec).fill_ = L'0';
    (pbVar2->super_align_spec).align_ = ALIGN_NUMERIC;
    pcVar5 = pcVar5 + 1;
    if (pcVar5 == end) {
      return pcVar5;
    }
  }
  local_38 = parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                       (pcVar5,end,handler);
  if (local_38 == end) {
    return local_38;
  }
  if (*local_38 == '.') {
    pcVar5 = local_38 + 1;
    if (pcVar5 == end) {
LAB_00110354:
      local_38 = pcVar5;
      basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"missing precision specifier");
      return pcVar5;
    }
    if ((int)*pcVar5 - 0x30U < 10) {
      local_38 = pcVar5;
      uVar4 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        (&local_38,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_core_format_specs).precision = uVar4;
    }
    else {
      if (*pcVar5 != '{') goto LAB_00110354;
      begin_00 = local_38 + 2;
      local_38 = pcVar5;
      if (begin_00 != end) {
        local_30.handler = handler;
        begin_00 = parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                             (begin_00,end,&local_30);
      }
      pcVar5 = begin_00;
      if ((begin_00 == end) || (pcVar5 = begin_00 + 1, local_38 = pcVar5, *begin_00 != '}')) {
        basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                  ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"invalid format string");
        return pcVar5;
      }
    }
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"precision not allowed for this argument type");
    }
  }
  pcVar5 = local_38;
  if ((local_38 != end) && (*local_38 != '}')) {
    pcVar5 = local_38 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_core_format_specs).type = *local_38;
  }
  return pcVar5;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}